

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yescrypt-simd.c
# Opt level: O2

int yescrypt_kdf(yescrypt_shared_t *shared,yescrypt_local_t *local,uint8_t *passwd,size_t passwdlen,
                uint8_t *salt,size_t saltlen,uint64_t N,uint32_t r,uint32_t p,uint32_t t,uint32_t g,
                yescrypt_flags_t flags,uint8_t *buf,size_t buflen)

{
  uint8_t *buf_00;
  int iVar1;
  int iVar2;
  size_t buflen_00;
  ulong uVar3;
  size_t sStack_80;
  uint8_t dk [32];
  
  sStack_80 = passwdlen;
  if (((p != 0 && (flags & (__YESCRYPT_INIT_SHARED|YESCRYPT_RW)) == YESCRYPT_RW) && (0xff < N / p))
     && (0x1ffff < (N / p) * (ulong)r)) {
    iVar1 = yescrypt_kdf_body(shared,local,passwd,passwdlen,salt,saltlen,N >> 6,r,p,0,
                              flags | __YESCRYPT_PREHASH,dk,0x20);
    if (iVar1 != 0) {
      return -1;
    }
    sStack_80 = 0x20;
    passwd = dk;
  }
  uVar3 = (ulong)t;
  iVar1 = -g;
  while( true ) {
    buflen_00 = 0x20;
    buf_00 = dk;
    if (iVar1 == 0) {
      buflen_00 = buflen;
      buf_00 = buf;
    }
    iVar2 = yescrypt_kdf_body(shared,local,passwd,sStack_80,salt,saltlen,N,r,p,(uint32_t)uVar3,flags
                              ,buf_00,buflen_00);
    if ((iVar2 != 0) || (N = N << 2, N == 0)) break;
    uVar3 = uVar3 >> 1;
    iVar1 = iVar1 + 1;
    sStack_80 = 0x20;
    passwd = dk;
    if (iVar1 == 1) {
      return 0;
    }
  }
  return -1;
}

Assistant:

int
yescrypt_kdf(const yescrypt_shared_t * shared, yescrypt_local_t * local,
    const uint8_t * passwd, size_t passwdlen,
    const uint8_t * salt, size_t saltlen,
    uint64_t N, uint32_t r, uint32_t p, uint32_t t, uint32_t g,
    yescrypt_flags_t flags,
    uint8_t * buf, size_t buflen)
{
	uint8_t dk[32];

	if ((flags & (YESCRYPT_RW | __YESCRYPT_INIT_SHARED)) == YESCRYPT_RW &&
	    p >= 1 && N / p >= 0x100 && N / p * r >= 0x20000) {
		int retval = yescrypt_kdf_body(shared, local,
		    passwd, passwdlen, salt, saltlen,
		    N >> 6, r, p, 0, flags | __YESCRYPT_PREHASH,
		    dk, sizeof(dk));
		if (retval)
			return retval;
		passwd = dk;
		passwdlen = sizeof(dk);
	}

	do {
		uint8_t * dkp = g ? dk : buf;
		size_t dklen = g ? sizeof(dk) : buflen;
		int retval = yescrypt_kdf_body(shared, local,
		    passwd, passwdlen, salt, saltlen,
		    N, r, p, t, flags, dkp, dklen);
		if (retval)
			return retval;

		passwd = dkp;
		passwdlen = dklen;

		N <<= 2;
		if (!N)
			return -1;
		t >>= 1;
	} while (g--);

	return 0;
}